

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_random.hpp
# Opt level: O0

result_type __thiscall iutest::detail::iuRandom::Engine::gen(Engine *this)

{
  uint uVar1;
  uint t;
  Engine *this_local;
  
  uVar1 = this->m_v1 ^ this->m_v1 << 0xb;
  this->m_v1 = this->m_v2;
  this->m_v2 = this->m_v3;
  this->m_v3 = this->m_v4;
  this->m_v4 = this->m_v4 ^ this->m_v4 >> 0x13 ^ uVar1 ^ uVar1 >> 8;
  return this->m_v4;
}

Assistant:

result_type gen()
        {
            const unsigned int t = (m_v1 ^ (m_v1 << 11));
            m_v1 = m_v2;
            m_v2 = m_v3;
            m_v3 = m_v4;
            m_v4 = (m_v4 ^ (m_v4 >> 19)) ^ (t ^ (t >> 8));
            return m_v4;
        }